

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O0

DataType glu::getDataTypeVector(DataType scalarType,int size)

{
  int size_local;
  DataType scalarType_local;
  
  if ((((scalarType == TYPE_FLOAT) || (scalarType == TYPE_DOUBLE)) || (scalarType == TYPE_INT)) ||
     ((scalarType == TYPE_UINT || (scalarType == TYPE_BOOL)))) {
    size_local = scalarType + size + -1;
  }
  else {
    size_local = 0;
  }
  return size_local;
}

Assistant:

DataType getDataTypeVector (DataType scalarType, int size)
{
	DE_ASSERT(deInRange32(size, 1, 4));
	switch (scalarType)
	{
		case TYPE_FLOAT:
		case TYPE_DOUBLE:
		case TYPE_INT:
		case TYPE_UINT:
		case TYPE_BOOL:
			return (DataType)((int)scalarType + size - 1);
		default:
			return TYPE_INVALID;
	}
}